

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_node.c
# Opt level: O3

void NJDNode_set_pron(NJDNode *node,char *str)

{
  char *pcVar1;
  
  if (node->pron != (char *)0x0) {
    free(node->pron);
  }
  if ((str == (char *)0x0) || (*str == '\0')) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = strdup(str);
  }
  node->pron = pcVar1;
  return;
}

Assistant:

void NJDNode_set_pron(NJDNode * node, const char *str)
{
   if (node->pron != NULL)
      free(node->pron);
   if (str == NULL || strlen(str) == 0)
      node->pron = NULL;
   else
      node->pron = strdup(str);
}